

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser.cpp
# Opt level: O3

void __thiscall amrex::Parser::define(Parser *this,string *func_body)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  element_type *peVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  YY_BUFFER_STATE b;
  amrex_parser *paVar6;
  Data *__tmp;
  ulong uVar7;
  string f;
  long *local_d0 [2];
  long local_c0 [18];
  
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0080f430;
  p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[2]._M_use_count = 0;
  p_Var4[2]._M_weak_count = 0;
  p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[3]._M_use_count = 0;
  p_Var4[3]._M_weak_count = 0;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)(p_Var4 + 2);
  p_Var4[1]._M_use_count = 0;
  p_Var4[1]._M_weak_count = 0;
  p_Var4[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[4]._M_use_count = 0;
  p_Var4[4]._M_weak_count = 0;
  (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var4 + 1);
  this_00 = (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (func_body->_M_string_length != 0) {
    std::__cxx11::string::_M_assign
              ((string *)
               (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    peVar1 = (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    _Var5._M_current = (peVar1->m_expression)._M_dataplus._M_p;
    local_d0[0] = (long *)CONCAT71(local_d0[0]._1_7_,10);
    _Var5 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var5,_Var5._M_current + (peVar1->m_expression)._M_string_length,
                       (_Iter_equals_val<const_char>)local_d0);
    peVar2 = (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar3 = (peVar1->m_expression)._M_dataplus._M_p;
    uVar7 = (long)_Var5._M_current - (long)pcVar3;
    if (pcVar3 + (peVar1->m_expression)._M_string_length ==
        (peVar2->m_expression)._M_dataplus._M_p + (peVar2->m_expression)._M_string_length) {
      (peVar1->m_expression)._M_string_length = uVar7;
      pcVar3[uVar7] = '\0';
    }
    else {
      std::__cxx11::string::_M_erase((ulong)peVar1,uVar7);
    }
    peVar1 = (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar3 = (peVar1->m_expression)._M_dataplus._M_p;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar3,pcVar3 + (peVar1->m_expression)._M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    b = amrex_parser_scan_string((char *)local_d0[0]);
    amrex_parserparse();
    paVar6 = amrex_parser_new();
    ((this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_parser = paVar6;
    amrex_parser_delete_buffer(b);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
  }
  return;
}

Assistant:

void
Parser::define (std::string const& func_body)
{
    m_data = std::make_shared<Data>();

    if (!func_body.empty()) {
        m_data->m_expression = func_body;
        m_data->m_expression.erase(std::remove(m_data->m_expression.begin(),
                                               m_data->m_expression.end(),'\n'),
                                   m_data->m_expression.end());
        std::string f = m_data->m_expression + "\n";

        YY_BUFFER_STATE buffer = amrex_parser_scan_string(f.c_str());
        try {
            amrex_parserparse();
        } catch (const std::runtime_error& e) {
            throw std::runtime_error(std::string(e.what()) + " in Parser expression \""
                                     + m_data->m_expression + "\"");
        }
        m_data->m_parser = amrex_parser_new();
        amrex_parser_delete_buffer(buffer);
    }
}